

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.cpp
# Opt level: O0

deBool vk::BinaryRegistryDetail::BinaryIndexHashImpl_insert
                 (BinaryIndexHashImpl *hash,ProgramBinary *key,deUint32 value)

{
  int newSlotTableSize;
  deBool dVar1;
  deUint32 dVar2;
  uint uVar3;
  BinaryIndexHashImplSlot *pBVar4;
  BinaryIndexHashImplSlot *nextSlot;
  BinaryIndexHashImplSlot *slot;
  int slotNdx;
  deUint32 value_local;
  ProgramBinary *key_local;
  BinaryIndexHashImpl *hash_local;
  
  if (hash->slotTableSize * 4 <= hash->numElements + 1) {
    newSlotTableSize = deMax32(4,hash->slotTableSize << 1);
    dVar1 = BinaryIndexHashImpl_rehash(hash,newSlotTableSize);
    if (dVar1 == 0) {
      return 0;
    }
  }
  dVar2 = anon_unknown_8::binaryHash(key);
  uVar3 = dVar2 & hash->slotTableSize - 1U;
  nextSlot = hash->slotTable[(int)uVar3];
  if (hash->slotTable[(int)uVar3] == (BinaryIndexHashImplSlot *)0x0) {
    nextSlot = BinaryIndexHashImpl_allocSlot(hash);
    if (nextSlot == (BinaryIndexHashImplSlot *)0x0) {
      return 0;
    }
    hash->slotTable[(int)uVar3] = nextSlot;
  }
  while( true ) {
    while( true ) {
      if (nextSlot->numUsed != 4) {
        nextSlot->keys[nextSlot->numUsed] = key;
        nextSlot->values[nextSlot->numUsed] = value;
        nextSlot->numUsed = nextSlot->numUsed + 1;
        hash->numElements = hash->numElements + 1;
        return 1;
      }
      if (nextSlot->nextSlot == (BinaryIndexHashImplSlot *)0x0) break;
      nextSlot = nextSlot->nextSlot;
    }
    pBVar4 = BinaryIndexHashImpl_allocSlot(hash);
    if (pBVar4 == (BinaryIndexHashImplSlot *)0x0) break;
    nextSlot->nextSlot = pBVar4;
    nextSlot = pBVar4;
  }
  return 0;
}

Assistant:

BinaryIndexHash::BinaryIndexHash (void)
	: m_hash(BinaryIndexHashImpl_create(m_memPool.getRawPool()))
{
	if (!m_hash)
		throw std::bad_alloc();
}